

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::shape_def,std::allocator<xray_re::shape_def>>,write_shape>
          (xr_writer *this,undefined8 *container)

{
  shape_def *psVar1;
  shape_def *s;
  write_shape local_21;
  
  psVar1 = (shape_def *)container[1];
  for (s = (shape_def *)*container; s != psVar1; s = s + 1) {
    write_shape::operator()(&local_21,s,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}